

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

double bernoulli_poly(int n,double x)

{
  double *b;
  int *row;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  
  uVar2 = (long)n * 8 + 8;
  if (n < -1) {
    uVar2 = 0xffffffffffffffff;
  }
  uVar1 = (long)n * 4 + 4;
  if (n < -1) {
    uVar1 = 0xffffffffffffffff;
  }
  b = (double *)operator_new__(uVar2);
  bernoulli_number(n,b);
  row = (int *)operator_new__(uVar1);
  for (iVar3 = 0; iVar3 <= n; iVar3 = iVar3 + 1) {
    comb_row_next(n,row);
  }
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  dVar4 = 1.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar4 = dVar4 * x + (double)row[uVar1 + 1] * b[uVar1 + 1];
  }
  operator_delete__(row);
  operator_delete__(b);
  return dVar4;
}

Assistant:

BURKHARDT_EXPORT
double bernoulli_poly ( int n, double x )

//****************************************************************************80
//
//  Purpose:
//
//    BERNOULLI_POLY evaluates the Bernoulli polynomial of order N at X.
//
//  Discussion:
//
//    Thanks to Bart Vandewoestyne for pointing out an error in the previous
//    documentation, 31 January 2008.
//
//    Special values of the Bernoulli polynomial include:
//
//      B(N,0) = B(N,1) = B(N), the N-th Bernoulli number.
//
//      B'(N,X) = N * B(N-1,X)
//
//      B(N,X+1) - B(N,X) = N * X^(N-1)
//      B(N,X) = (-1)^N * B(N,1-X)
//
//    A formula for the Bernoulli polynomial in terms of the Bernoulli
//    numbers is:
//
//      B(N,X) = sum ( 0 <= K <= N ) B(K) * C(N,K) * X^(N-K)
//
//    The first few polynomials include:
//
//      B(0,X) = 1
//      B(1,X) = X    - 1/2
//      B(2,X) = X^2 -   X      +  1/6
//      B(3,X) = X^3 - 3/2*X^2 +  1/2*X
//      B(4,X) = X^4 - 2*X^3   +      X^2 - 1/30
//      B(5,X) = X^5 - 5/2*X^4 +  5/3*X^3 - 1/6*X
//      B(6,X) = X^6 - 3*X^5   +  5/2*X^4 - 1/2*X^2 + 1/42
//      B(7,X) = X^7 - 7/2*X^6 +  7/2*X^5 - 7/6*X^3 + 1/6*X
//      B(8,X) = X^8 - 4*X^7   + 14/3*X^6 - 7/3*X^4 + 2/3*X^2 - 1/30
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    31 January 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the Bernoulli polynomial to
//    be evaluated.  N must be 0 or greater.
//
//    Input, double X, the value of X at which the polynomial is to
//    be evaluated.
//
//    Output, double BERNOULLI_POLY, the value of B(N,X).
//
{
  int *c;
  int i;
  double value;
  double *work;

  work = new double[n+1];
  bernoulli_number ( n, work );
//
//  Get row N of Pascal's triangle.
//
  c = new int[n+1];
  for ( i = 0; i <= n; i++ )
  {
    comb_row_next ( n, c );
  }

  value = 1.0;
  for ( i = 1; i <= n; i++ )
  {
    value = value * x + work[i] * double(c[i]);
  }

  delete [] c;
  delete [] work;

  return value;
}